

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

long __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
fill_internal_input(cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
                    *this,short *input_buffer,long *input_frames_count,short *output_buffer,
                   long param_4)

{
  size_t sVar1;
  short *psVar2;
  long lVar3;
  ulong output_frame_count;
  size_t frames_resampled;
  size_t local_28;
  
  sVar1 = cubeb_resampler_speex_one_way<short>::output_for_input
                    ((this->input_processor)._M_t.
                     super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                     .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>.
                     _M_head_impl,(uint32_t)*input_frames_count);
  cubeb_resampler_speex_one_way<short>::input
            ((this->input_processor)._M_t.
             super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl,
             input_buffer,*input_frames_count);
  output_frame_count = sVar1 & 0xffffffff;
  if (output_frame_count == 0) {
    lVar3 = *input_frames_count;
  }
  else {
    local_28 = 0;
    psVar2 = cubeb_resampler_speex_one_way<short>::output
                       ((this->input_processor)._M_t.
                        super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                        .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>.
                        _M_head_impl,output_frame_count,&local_28);
    *input_frames_count = local_28;
    lVar3 = (*this->data_callback)
                      (this->stream,this->user_ptr,psVar2,(void *)0x0,output_frame_count);
    lVar3 = (lVar3 / (long)output_frame_count) * *input_frames_count;
  }
  return lVar3;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_input(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long /*output_frames_needed*/)
{
  assert(input_buffer && input_frames_count && *input_frames_count &&
         !output_buffer);

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  uint32_t resampled_frame_count =
      input_processor->output_for_input(*input_frames_count);

  /* process the input, and present exactly `output_frames_needed` in the
   * callback. */
  input_processor->input(input_buffer, *input_frames_count);

  /* resampled_frame_count == 0 happens if the resampler
   * doesn't have enough input frames buffered to produce 1 resampled frame. */
  if (resampled_frame_count == 0) {
    return *input_frames_count;
  }

  size_t frames_resampled = 0;
  resampled_input =
      input_processor->output(resampled_frame_count, &frames_resampled);
  *input_frames_count = frames_resampled;

  long got = data_callback(stream, user_ptr, resampled_input, nullptr,
                           resampled_frame_count);

  /* Return the number of initial input frames or part of it.
   * Since output_frames_needed == 0 in input scenario, the only
   * available number outside resampler is the initial number of frames. */
  return (*input_frames_count) * (got / resampled_frame_count);
}